

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset_zone.cpp
# Opt level: O1

void __thiscall
sf2cute::SFPresetZone::set_instrument
          (SFPresetZone *this,weak_ptr<sf2cute::SFInstrument> *instrument)

{
  int iVar1;
  SFPreset *pSVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  SoundFont *this_00;
  int iVar4;
  bool bVar5;
  shared_ptr<sf2cute::SFInstrument> local_20;
  
  pSVar2 = this->parent_preset_;
  if ((((pSVar2 != (SFPreset *)0x0) && (pSVar2->parent_file_ != (SoundFont *)0x0)) &&
      (p_Var3 = (instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi, p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
     && (p_Var3->_M_use_count != 0)) {
    this_00 = pSVar2->parent_file_;
    local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = p_Var3->_M_use_count;
      do {
        if (iVar4 == 0) {
          local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = p_Var3->_M_use_count;
        bVar5 = iVar4 == iVar1;
        if (bVar5) {
          p_Var3->_M_use_count = iVar4 + 1;
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        UNLOCK();
      } while (!bVar5);
    }
    if (local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = (local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count == 0;
    }
    if (bVar5) {
      local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    SoundFont::AddInstrument(this_00,&local_20);
    if (local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  std::__weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->instrument_).
              super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>,
             &instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void SFPresetZone::set_instrument(std::weak_ptr<SFInstrument> instrument) {
  if (has_parent_file() && !instrument.expired()) {
    parent_file().AddInstrument(instrument.lock());
  }
  instrument_ = std::move(instrument);
}